

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreateSharedResourcesTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  TestStatus *pTVar1;
  deUint32 maxResourceConsumers_;
  CreateThread<vkt::api::(anonymous_namespace)::ShaderModule> *this;
  bool bVar2;
  Resources res;
  ThreadGroup threads;
  Environment env;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_b8;
  TestStatus *local_a8;
  Resources local_a0;
  ThreadGroup local_98;
  Environment local_68;
  
  local_a8 = __return_storage_ptr__;
  maxResourceConsumers_ = getDefaultTestThreadCount();
  Environment::Environment(&local_68,context,maxResourceConsumers_);
  local_a0.binary =
       ::vk::ProgramCollection<vk::ProgramBinary>::get(local_68.programBinaries,&params->binaryName)
  ;
  ThreadGroup::ThreadGroup(&local_98);
  while (pTVar1 = local_a8, bVar2 = maxResourceConsumers_ != 0,
        maxResourceConsumers_ = maxResourceConsumers_ - 1, bVar2) {
    this = (CreateThread<vkt::api::(anonymous_namespace)::ShaderModule> *)operator_new(0x88);
    CreateThread<vkt::api::(anonymous_namespace)::ShaderModule>::CreateThread
              (this,&local_68,&local_a0,params);
    local_b8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = (ThreadGroupThread *)this;
    ThreadGroup::add(&local_98,&local_b8);
    if ((CreateThread<vkt::api::(anonymous_namespace)::ShaderModule> *)
        local_b8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (CreateThread<vkt::api::(anonymous_namespace)::ShaderModule> *)0x0) {
      (*(((ThreadGroupThread *)
         &(local_b8.
           super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
           .m_data.ptr)->super_Thread)->super_Thread)._vptr_Thread[1])();
      local_b8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
  }
  ThreadGroup::run(local_a8,&local_98);
  ThreadGroup::~ThreadGroup(&local_98);
  return pTVar1;
}

Assistant:

tcu::TestStatus multithreadedCreateSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const deUint32						numThreads	= getDefaultTestThreadCount();
	const Environment					env			(context, numThreads);
	const typename Object::Resources	res			(env, params);
	ThreadGroup							threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, res, params)));

	return threads.run();
}